

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::unwrap(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Sys *this,Token *token)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<Vault::HttpResponse> response;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  Path local_150;
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  Url local_f0;
  _Optional_payload_base<Vault::HttpResponse> local_d0;
  _Optional_payload_base<Vault::HttpResponse> local_80;
  
  iVar2 = (*this->client_->_vptr_Client[10])();
  local_170 = &local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"wrapping/unwrap","");
  local_150.value_._M_dataplus._M_p = (pointer)&local_150.value_.field_2;
  if (local_170 == &local_160) {
    local_150.value_.field_2._8_8_ = local_160._8_8_;
  }
  else {
    local_150.value_._M_dataplus._M_p = (pointer)local_170;
  }
  local_150.value_.field_2._M_allocated_capacity._1_7_ = local_160._M_allocated_capacity._1_7_;
  local_150.value_.field_2._M_local_buf[0] = local_160._M_local_buf[0];
  local_150.value_._M_string_length = local_168;
  local_168 = 0;
  local_160._M_local_buf[0] = '\0';
  local_170 = &local_160;
  getUrl(&local_f0,this,&local_150);
  (*this->client_->_vptr_Client[9])(local_110);
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (&local_d0,(long *)CONCAT44(extraout_var,iVar2),&local_f0,token,local_110,local_130);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.value_._M_dataplus._M_p != &local_f0.value_.field_2) {
    operator_delete(local_f0.value_._M_dataplus._M_p,
                    local_f0.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.value_._M_dataplus._M_p != &local_150.value_.field_2) {
    operator_delete(local_150.value_._M_dataplus._M_p,
                    local_150.value_.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,
                    CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]) + 1);
  }
  local_80._M_engaged = false;
  if (local_d0._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_construct<Vault::HttpResponse_const&>
              (&local_80,(HttpResponse *)&local_d0);
  }
  bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_80);
  if (local_80._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_80);
  }
  if (bVar1) {
    if (local_d0._M_engaged == false) {
LAB_0019897f:
      std::__throw_bad_optional_access();
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10);
    bVar1 = true;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               local_d0._M_payload._M_value.body.value_._M_dataplus._M_p,
               (pointer)(local_d0._M_payload._M_value.body.value_._M_string_length +
                        (long)local_d0._M_payload._M_value.body.value_._M_dataplus._M_p));
  }
  else {
    if (local_d0._M_engaged != false) {
      iVar2 = (*this->client_->_vptr_Client[10])();
      if (local_d0._M_engaged == false) goto LAB_0019897f;
      HttpClient::handleResponseError
                ((HttpClient *)CONCAT44(extraout_var_00,iVar2),(HttpResponse *)&local_d0);
    }
    bVar1 = false;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = bVar1;
  if (local_d0._M_engaged == true) {
    std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::Sys::unwrap(const Token &token) {
  auto response = client_.getHttpClient().post(
      getUrl(Path{"wrapping/unwrap"}), token, client_.getNamespace(), "");

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client_.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}